

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t _elemsize;
  _func_int **pp_Var7;
  size_t sVar8;
  size_t sVar9;
  Layer *pLVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  void *pvVar15;
  ulong uVar16;
  void *pvVar17;
  undefined4 *puVar18;
  ulong uVar19;
  undefined4 *puVar20;
  int iVar21;
  int iVar22;
  uint _w;
  long lVar23;
  undefined4 *puVar24;
  long lVar25;
  int iVar26;
  _func_int *p_Var27;
  uint _h;
  ulong uVar28;
  Option opt_g;
  int local_1c8;
  long local_178;
  long local_170;
  Mat local_158;
  Mat local_108;
  long local_c0;
  long local_b8;
  ulong local_b0;
  long local_a8;
  long local_a0;
  ulong local_98;
  ulong local_90;
  long local_88;
  long local_80;
  undefined4 local_78;
  int iStack_74;
  Allocator *pAStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  int iStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  _elemsize = bottom_blob->elemsize;
  p_Var27 = this->_vptr_Convolution_x86[-3];
  iVar3 = *(int *)(p_Var27 + 0x2c + (long)&(this->weight_winograd23_data).data);
  iVar4 = *(int *)(p_Var27 + 0x3c + (long)&(this->weight_winograd23_data).data);
  uVar5 = *(uint *)(p_Var27 + 0x34 + (long)&(this->weight_winograd23_data).data);
  uVar14 = (ulong)uVar5;
  iVar22 = (iVar3 + -1) * uVar5 + 1;
  iVar13 = (iVar1 - iVar22) / iVar4;
  iVar21 = iVar13 + 1;
  Mat::create(top_blob,iVar21,(iVar2 - iVar22) / iVar4 + 1,
              *(int *)(p_Var27 + 0x28 + (long)&(this->weight_winograd23_data).data),_elemsize,
              opt->blob_allocator);
  local_1c8 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_108.cstep = 0;
    local_108.data = (void *)0x0;
    local_108.refcount._0_4_ = 0;
    local_108.refcount._4_4_ = 0;
    local_108.elemsize._0_4_ = 0;
    local_108.elemsize._4_4_ = 0;
    local_108.elempack = 0;
    local_108.allocator = (Allocator *)0x0;
    local_108.dims = 0;
    local_108.w = 0;
    local_108.h = 0;
    local_108.d = 0;
    local_108.c = 0;
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    if (0 < (int)uVar5) {
      local_b8 = (long)iVar1 << 2;
      local_c0 = (long)iVar13 * 4 + 4;
      local_80 = (long)(int)(iVar21 * uVar5) << 2;
      local_178 = 0;
      local_170 = 0;
      uVar16 = 0;
      do {
        uVar11 = (long)(int)((uVar5 + iVar2 + -1) - (int)uVar16) / (long)(int)uVar5;
        iVar13 = (int)uVar11;
        uVar19 = (long)(iVar13 - iVar3) / (long)iVar4;
        local_90 = uVar19 & 0xffffffff;
        _h = (int)uVar19 + 1;
        uVar19 = 0;
        local_b0 = uVar16;
        local_a8 = local_170;
        local_a0 = local_178;
        do {
          uVar16 = (long)(int)((uVar5 + iVar1 + -1) - (int)uVar19) / (long)(int)uVar5;
          iVar22 = (int)uVar16;
          iVar21 = (iVar22 - iVar3) / iVar4;
          local_98 = uVar19;
          Mat::create(&local_108,iVar22,iVar13,bottom_blob->c,_elemsize,opt->workspace_allocator);
          local_1c8 = -100;
          if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0))
          goto LAB_001b5981;
          _w = iVar21 + 1;
          Mat::create(&local_158,_w,_h,
                      *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                              (long)&(this->weight_winograd23_data).data),_elemsize,
                      opt->workspace_allocator);
          if ((local_158.data == (void *)0x0) || ((long)local_158.c * local_158.cstep == 0))
          goto LAB_001b5981;
          iVar6 = bottom_blob->c;
          if (0 < (long)iVar6) {
            lVar23 = (long)bottom_blob->data + local_170;
            local_88 = bottom_blob->cstep * bottom_blob->elemsize;
            lVar25 = 0;
            pvVar15 = local_108.data;
            do {
              if (0 < iVar13) {
                iVar26 = 0;
                uVar19 = 0;
                pvVar17 = pvVar15;
                do {
                  if (0 < iVar22) {
                    puVar18 = (undefined4 *)(lVar23 + (long)iVar26 * 4);
                    uVar28 = 0;
                    do {
                      *(undefined4 *)((long)pvVar17 + uVar28 * 4) = *puVar18;
                      uVar28 = uVar28 + 1;
                      puVar18 = puVar18 + uVar14;
                    } while ((uVar16 & 0xffffffff) != uVar28);
                  }
                  uVar19 = uVar19 + 1;
                  iVar26 = iVar26 + uVar5 * iVar1;
                  pvVar17 = (void *)((long)pvVar17 + (long)iVar22 * 4);
                } while (uVar19 != (uVar11 & 0xffffffff));
              }
              lVar25 = lVar25 + 1;
              lVar23 = lVar23 + local_88;
              pvVar15 = (void *)((long)pvVar15 +
                                local_108.cstep *
                                CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
            } while (lVar25 != iVar6);
          }
          local_78 = *(undefined4 *)opt;
          iStack_74 = opt->num_threads;
          local_68 = *(undefined4 *)&opt->workspace_allocator;
          uStack_64 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
          iStack_60 = opt->openmp_blocktime;
          uStack_5c._0_1_ = opt->use_winograd_convolution;
          uStack_5c._1_1_ = opt->use_sgemm_convolution;
          uStack_5c._2_1_ = opt->use_int8_inference;
          uStack_5c._3_1_ = opt->use_vulkan_compute;
          local_58._0_1_ = opt->use_bf16_storage;
          local_58._1_1_ = opt->use_fp16_packed;
          local_58._2_1_ = opt->use_fp16_storage;
          local_58._3_1_ = opt->use_fp16_arithmetic;
          uStack_54._0_1_ = opt->use_int8_packed;
          uStack_54._1_1_ = opt->use_int8_storage;
          uStack_54._2_1_ = opt->use_int8_arithmetic;
          uStack_54._3_1_ = opt->use_packing_layout;
          uStack_50._0_1_ = opt->use_shader_pack8;
          uStack_50._1_1_ = opt->use_subgroup_basic;
          uStack_50._2_1_ = opt->use_subgroup_vote;
          uStack_50._3_1_ = opt->use_subgroup_ballot;
          uStack_4c._0_1_ = opt->use_subgroup_shuffle;
          uStack_4c._1_1_ = opt->use_image_storage;
          uStack_4c._2_1_ = opt->use_tensor_storage;
          uStack_4c._3_1_ = opt->use_reserved_0;
          local_48 = opt->flush_denormals;
          uStack_44._0_1_ = opt->use_local_pool_allocator;
          uStack_44._1_1_ = opt->use_shader_local_memory;
          uStack_44._2_1_ = opt->use_cooperative_matrix;
          uStack_44._3_1_ = opt->use_winograd23_convolution;
          uStack_40._0_1_ = opt->use_winograd43_convolution;
          uStack_40._1_1_ = opt->use_winograd63_convolution;
          uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
          uStack_40._3_1_ = opt->use_reserved_7;
          uStack_3c._0_1_ = opt->use_reserved_8;
          uStack_3c._1_1_ = opt->use_reserved_9;
          uStack_3c._2_1_ = opt->use_reserved_10;
          uStack_3c._3_1_ = opt->use_reserved_11;
          pAStack_70 = local_158.allocator;
          (*this->convolution_dilation1->_vptr_Layer[7])
                    (this->convolution_dilation1,&local_108,&local_158,&local_78);
          pp_Var7 = this->_vptr_Convolution_x86;
          p_Var27 = pp_Var7[-3];
          if (0 < *(int *)(p_Var27 + 0x28 + (long)&(this->weight_winograd23_data).data)) {
            sVar8 = top_blob->cstep;
            puVar18 = (undefined4 *)((long)top_blob->data + local_178);
            sVar9 = top_blob->elemsize;
            lVar23 = 0;
            pvVar15 = local_158.data;
            do {
              if (-1 < (int)local_90) {
                uVar16 = 0;
                puVar24 = puVar18;
                pvVar17 = pvVar15;
                do {
                  if (-1 < iVar21) {
                    uVar19 = 0;
                    puVar20 = puVar24;
                    do {
                      *puVar20 = *(undefined4 *)((long)pvVar17 + uVar19 * 4);
                      uVar19 = uVar19 + 1;
                      puVar20 = puVar20 + uVar14;
                    } while (_w != uVar19);
                  }
                  uVar16 = uVar16 + 1;
                  puVar24 = (undefined4 *)((long)puVar24 + local_80);
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)_w * 4);
                } while (uVar16 != _h);
                p_Var27 = pp_Var7[-3];
              }
              lVar23 = lVar23 + 1;
              puVar18 = (undefined4 *)((long)puVar18 + sVar8 * sVar9);
              pvVar15 = (void *)((long)pvVar15 +
                                local_158.cstep *
                                CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize));
            } while (lVar23 < *(int *)(p_Var27 + 0x28 + (long)&(this->weight_winograd23_data).data))
            ;
          }
          uVar19 = local_98 + 1;
          local_170 = local_170 + 4;
          local_178 = local_178 + 4;
        } while (uVar19 != uVar14);
        uVar16 = local_b0 + 1;
        local_170 = local_a8 + local_b8;
        local_178 = local_a0 + local_c0;
      } while (uVar16 != uVar14);
    }
    pLVar10 = this->activation;
    if (pLVar10 == (Layer *)0x0) {
      local_1c8 = 0;
    }
    else {
      (*pLVar10->_vptr_Layer[9])(pLVar10,top_blob,opt);
      local_1c8 = 0;
    }
LAB_001b5981:
    piVar12 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar12 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
    if (piVar12 != (int *)0x0) {
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        if (local_108.allocator == (Allocator *)0x0) {
          if (local_108.data != (void *)0x0) {
            free(local_108.data);
          }
        }
        else {
          (*(local_108.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return local_1c8;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}